

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall correctness_shr_signed_Test::TestBody(correctness_shr_signed_Test *this)

{
  char *pcVar1;
  AssertHelper local_c8;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  big_integer a;
  big_integer local_40;
  
  big_integer::big_integer(&a,-0x4d2);
  big_integer::big_integer(&local_40,&a);
  operator>>((big_integer *)&gtest_ar_1,&local_40,3);
  local_c8.data_._0_4_ = 0xffffff65;
  testing::internal::CmpHelperEQ<big_integer,int>
            ((internal *)&gtest_ar,"a >> 3","-155",(big_integer *)&gtest_ar_1,(int *)&local_c8);
  big_integer::~big_integer((big_integer *)&gtest_ar_1);
  big_integer::~big_integer(&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x1b9,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  big_integer::operator>>=(&a,3);
  gtest_ar.success_ = true;
  gtest_ar._1_3_ = 0xffffff;
  testing::internal::CmpHelperEQ<big_integer,int>
            ((internal *)&gtest_ar_1,"a","-155",&a,(int *)&gtest_ar);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x1bc,pcVar1);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  big_integer::~big_integer(&a);
  return;
}

Assistant:

TEST(correctness, shr_signed)
{
    big_integer a = -1234;

    EXPECT_EQ(a >> 3, -155);

    a >>= 3;
    EXPECT_EQ(a, -155);
}